

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

bool __thiscall
chaiscript::detail::Dispatch_Engine::is_attribute_call
          (Dispatch_Engine *this,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funs,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                  *t_params,bool t_has_params,Type_Conversions_State *t_conversions)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  undefined3 in_register_00000009;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *fun;
  pointer psVar4;
  bool bVar5;
  
  if ((CONCAT31(in_register_00000009,t_has_params) == 0) ||
     ((t_params->
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl
      .super__Vector_impl_data._M_start ==
      (t_params->
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl
      .super__Vector_impl_data._M_finish)) {
    bVar5 = false;
  }
  else {
    psVar1 = (t_funs->
             super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (t_funs->
                  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; bVar5 = psVar4 != psVar1, bVar5;
        psVar4 = psVar4 + 1) {
      iVar3 = (*((psVar4->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->_vptr_Proxy_Function_Base[4])();
      if (((char)iVar3 != '\0') &&
         (peVar2 = (psVar4->
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr,
         iVar3 = (*peVar2->_vptr_Proxy_Function_Base[7])
                           (peVar2,(t_params->
                                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                   )._M_impl.super__Vector_impl_data._M_start,t_conversions),
         (char)iVar3 != '\0')) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool is_attribute_call(const std::vector<Proxy_Function> &t_funs, const std::vector<Boxed_Value> &t_params,
            bool t_has_params, const Type_Conversions_State &t_conversions) const
        {
          if (!t_has_params || t_params.empty()) {
            return false;
          }

          for (const auto &fun : t_funs) {
            if (fun->is_attribute_function()) {
              if (fun->compare_first_type(t_params[0], t_conversions)) {
                return true;
              }
            }
          }

          return false;
        }